

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double *pdVar20;
  long row;
  long lVar21;
  int xj;
  long lVar22;
  long row_00;
  double dVar23;
  
  row = 4;
  do {
    if (row == 0xf) {
      return;
    }
    if (0 < nshape->fStore[row + -4]) {
      iVar18 = (int)row;
      iVar17 = pztopology::TPZTetrahedron::NSideNodes(iVar18);
      if (iVar17 == 4) {
        dVar23 = *(double *)(&DAT_0130a500 + row * 8);
        pdVar20 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar1 = *pdVar20;
        pdVar20 = TPZFMatrix<double>::operator()(phi,1,0);
        dVar2 = *pdVar20;
        pdVar20 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar3 = *pdVar20;
        pdVar20 = TPZFMatrix<double>::operator()(phi,3,0);
        dVar4 = *pdVar20;
        pdVar20 = TPZFMatrix<double>::operator()(phi,row,0);
        *pdVar20 = dVar1 * dVar23 * dVar2 * dVar3 * dVar4;
        for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
          pdVar20 = TPZFMatrix<double>::operator()(dphi,lVar21,0);
          dVar1 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,1,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,2,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,3,0);
          dVar4 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,0,0);
          dVar5 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,lVar21,1);
          dVar6 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,2,0);
          dVar7 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,3,0);
          dVar8 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,0,0);
          dVar9 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,1,0);
          dVar10 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,lVar21,2);
          dVar11 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,3,0);
          dVar12 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,0,0);
          dVar13 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,1,0);
          dVar14 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,2,0);
          dVar15 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,lVar21,3);
          dVar16 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,lVar21,row);
          *pdVar20 = (dVar13 * dVar14 * dVar15 * dVar16 +
                     dVar9 * dVar10 * dVar11 * dVar12 +
                     dVar5 * dVar6 * dVar7 * dVar8 + dVar1 * dVar2 * dVar3 * dVar4) * dVar23;
        }
      }
      else {
        if (iVar17 == 3) {
          iVar17 = pztopology::TPZTetrahedron::SideNodeLocId(iVar18,0);
          iVar19 = pztopology::TPZTetrahedron::SideNodeLocId(iVar18,1);
          iVar18 = pztopology::TPZTetrahedron::SideNodeLocId(iVar18,2);
          dVar23 = *(double *)(&DAT_0130a500 + row * 8);
          lVar21 = (long)iVar17;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar1 = *pdVar20;
          lVar22 = (long)iVar19;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          row_00 = (long)iVar18;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row_00,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row,0);
          *pdVar20 = dVar1 * dVar23 * dVar2 * dVar3;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
          dVar1 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row_00,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar4 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,0,lVar22);
          dVar5 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row_00,0);
          dVar6 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar7 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar8 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,0,row_00);
          dVar9 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,0,row);
          *pdVar20 = (dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3) *
                     dVar23;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
          dVar1 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row_00,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar4 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,1,lVar22);
          dVar5 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row_00,0);
          dVar6 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar7 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar8 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,1,row_00);
          dVar9 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,1,row);
          *pdVar20 = (dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3) *
                     dVar23;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,2,lVar21);
          dVar1 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row_00,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar4 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,2,lVar22);
          dVar5 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row_00,0);
          dVar6 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar7 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar8 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,2,row_00);
          dVar23 = (dVar7 * dVar8 * *pdVar20 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3) *
                   dVar23;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,2,row);
        }
        else {
          if (iVar17 != 2) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                       ,0xd4);
          }
          iVar17 = pztopology::TPZTetrahedron::SideNodeLocId(iVar18,0);
          iVar18 = pztopology::TPZTetrahedron::SideNodeLocId(iVar18,1);
          dVar23 = *(double *)(&DAT_0130a500 + row * 8);
          lVar21 = (long)iVar17;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar1 = *pdVar20;
          lVar22 = (long)iVar18;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,row,0);
          *pdVar20 = dVar1 * dVar23 * dVar2;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
          dVar1 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,0,lVar22);
          dVar4 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,0,row);
          *pdVar20 = (dVar3 * dVar4 + dVar1 * dVar2) * dVar23;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
          dVar1 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,1,lVar22);
          dVar4 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,1,row);
          *pdVar20 = (dVar3 * dVar4 + dVar1 * dVar2) * dVar23;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,2,lVar21);
          dVar1 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar22,0);
          dVar2 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar3 = *pdVar20;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,2,lVar22);
          dVar23 = (dVar3 * *pdVar20 + dVar1 * dVar2) * dVar23;
          pdVar20 = TPZFMatrix<double>::operator()(dphi,2,row);
        }
        *pdVar20 = dVar23;
      }
    }
    row = row + 1;
  } while( true );
}

Assistant:

void TPZShapeTetra::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
    REAL mult[] = {1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,27.,27.,27.,27.,54.};

    // 6 ribs
    for(int is=4; is<NSides; is++)
    {
        if(nshape[is-4] < 1) continue;
        int nsnodes = NSideNodes(is);
        switch(nsnodes)
        {
            case 2:
            {
                int is1 = SideNodeLocId(is,0);
                int is2 = SideNodeLocId(is,1);
                phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0);
                dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2));
                dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2));
                dphi(2,is) = mult[is]*(dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2));
            }
                break;
            case 3:
            {
                //int face = is-10;
                int is1 = SideNodeLocId(is,0); //ShapeFaceId[face][0];
                int is2 = SideNodeLocId(is,1); //ShapeFaceId[face][1];
                int is3 = SideNodeLocId(is,2); //ShapeFaceId[face][2];
                phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0)*phi(is3,0);
                dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3));
                dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3));
                dphi(2,is) = mult[is]*(dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3));
            }
                break;
            case 4:
            {
                phi(is,0) = mult[is]*phi(0,0)*phi(1,0)*phi(2,0)*phi(3,0);
                for(int xj=0;xj<3;xj++) {
                    dphi(xj,is) = mult[is]*(dphi(xj,0)* phi(1 ,0)* phi(2 ,0)* phi(3 ,0) +
                    phi(0, 0)*dphi(xj,1)* phi(2 ,0)* phi(3 ,0) +
                    phi(0, 0)* phi(1 ,0)*dphi(xj,2)* phi(3 ,0) +
                    phi(0, 0)* phi(1 ,0)* phi(2 ,0)*dphi(xj,3));
                }
            }
                break;
                
            default:
                DebugStop();
        }
    }     
}